

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O1

void __thiscall antlr::CommonAST::~CommonAST(CommonAST *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BaseAST).super_AST._vptr_AST = (_func_int **)&PTR__CommonAST_002f8ed0;
  pcVar2 = (this->text)._M_dataplus._M_p;
  paVar1 = &(this->text).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_BaseAST).super_AST._vptr_AST = (_func_int **)&PTR__BaseAST_002f8db8;
  ASTRefCount<antlr::BaseAST>::~ASTRefCount(&(this->super_BaseAST).right);
  ASTRefCount<antlr::BaseAST>::~ASTRefCount(&(this->super_BaseAST).down);
  return;
}

Assistant:

virtual ~CommonAST()
	{
	}